

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chan.h
# Opt level: O3

optional<std::function<void_()>_> * __thiscall
dap::Chan<std::function<void_()>_>::take
          (optional<std::function<void_()>_> *__return_storage_ptr__,
          Chan<std::function<void_()>_> *this)

{
  _Map_pointer ppfVar1;
  _Elt_pointer pfVar2;
  _Manager_type p_Var3;
  _Invoker_type p_Var4;
  unique_lock<std::mutex> lock;
  undefined8 local_48;
  undefined8 uStack_40;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->mutex;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  std::condition_variable::wait<dap::Chan<std::function<void()>>::take()::_lambda()_1_>
            (&this->cv,&local_30,(anon_class_8_1_8991fb9c)this);
  ppfVar1 = (this->queue).c.
            super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node;
  pfVar2 = (this->queue).c.
           super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  if (((long)(this->queue).c.
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last - (long)pfVar2 >> 5) +
      ((long)(this->queue).c.
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur -
       (long)(this->queue).c.
             super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
      ((((ulong)((long)ppfVar1 -
                (long)(this->queue).c.
                      super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
      (ulong)(ppfVar1 == (_Map_pointer)0x0)) * 0x10 == 0) {
    (__return_storage_ptr__->val).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->val)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->val).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->val).super__Function_base._M_functor + 8) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    p_Var3 = (pfVar2->super__Function_base)._M_manager;
    p_Var4 = pfVar2->_M_invoker;
    if (p_Var3 != (_Manager_type)0x0) {
      local_48 = *(undefined8 *)&(pfVar2->super__Function_base)._M_functor;
      uStack_40 = *(undefined8 *)((long)&(pfVar2->super__Function_base)._M_functor + 8);
      (pfVar2->super__Function_base)._M_manager = (_Manager_type)0x0;
      pfVar2->_M_invoker = (_Invoker_type)0x0;
    }
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&(this->queue).c);
    *(undefined8 *)&(__return_storage_ptr__->val).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->val).super__Function_base._M_functor + 8) = 0;
    (__return_storage_ptr__->val).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->val)._M_invoker = p_Var4;
    if (p_Var3 != (_Manager_type)0x0) {
      *(undefined8 *)&(__return_storage_ptr__->val).super__Function_base._M_functor = local_48;
      *(undefined8 *)((long)&(__return_storage_ptr__->val).super__Function_base._M_functor + 8) =
           uStack_40;
      (__return_storage_ptr__->val).super__Function_base._M_manager = p_Var3;
    }
    __return_storage_ptr__->set = true;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return __return_storage_ptr__;
}

Assistant:

optional<T> Chan<T>::take() {
  std::unique_lock<std::mutex> lock(mutex);
  cv.wait(lock, [&] { return queue.size() > 0 || closed; });
  if (queue.size() == 0) {
    return optional<T>();
  }
  auto out = std::move(queue.front());
  queue.pop();
  return optional<T>(std::move(out));
}